

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

void __thiscall Json::StyledWriter::writeIndent(StyledWriter *this)

{
  ulong uVar1;
  char *pcVar2;
  char last;
  StyledWriter *this_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::length();
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)&this->document_);
    if (*pcVar2 == ' ') {
      return;
    }
    if (*pcVar2 != '\n') {
      std::__cxx11::string::operator+=((string *)&this->document_,'\n');
    }
  }
  std::__cxx11::string::operator+=((string *)&this->document_,(string *)&this->indentString_);
  return;
}

Assistant:

void StyledWriter::writeIndent() {
  if (!document_.empty()) {
    char last = document_[document_.length() - 1];
    if (last == ' ') // already indented
      return;
    if (last != '\n') // Comments may add new-line
      document_ += '\n';
  }
  document_ += indentString_;
}